

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

uint32 er_hint_hash_fn(State *a,hash_fns_t *fns)

{
  uint uVar1;
  Hint *pHVar2;
  Rule *pRVar3;
  Term *pTVar4;
  uint uVar5;
  uint32 uVar6;
  ulong uVar7;
  
  if ((a->error_recovery_hints).n != 0) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      pHVar2 = (a->error_recovery_hints).v[uVar7];
      pRVar3 = pHVar2->rule;
      pTVar4 = ((pRVar3->elems).v[(pRVar3->elems).n - 1]->e).term;
      uVar1 = pHVar2->depth;
      uVar5 = strhashl(pTVar4->string,pTVar4->string_len);
      uVar6 = uVar5 + uVar1 * 0xd + uVar6 + 0xd;
      pRVar3 = (a->error_recovery_hints).v[uVar7]->rule;
      if (pRVar3 != (Rule *)0x0) {
        uVar6 = uVar6 + pRVar3->prod->index * 0x2717;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (a->error_recovery_hints).n);
    return uVar6;
  }
  return 0;
}

Assistant:

static uint32 er_hint_hash_fn(State *a, hash_fns_t *fns) {
  VecHint *sa = &a->error_recovery_hints;
  uint32 hash = 0, i;
  Term *ta;
  (void)fns;

  for (i = 0; i < sa->n; i++) {
    ta = sa->v[i]->rule->elems.v[sa->v[i]->rule->elems.n - 1]->e.term;
    hash += (sa->v[i]->depth + 1) * 13;
    hash += strhashl(ta->string, ta->string_len);
    if (sa->v[i]->rule) hash += sa->v[i]->rule->prod->index * 10007;
  }
  return hash;
}